

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuMainlistAdd(rbu_file *p)

{
  rbu_vfs *prVar1;
  rbu_file *local_20;
  rbu_file *pIter;
  rbu_vfs *pRbuVfs;
  rbu_file *p_local;
  
  prVar1 = p->pRbuVfs;
  sqlite3_mutex_enter(prVar1->mutex);
  if (p->pRbu == (sqlite3rbu *)0x0) {
    for (local_20 = prVar1->pMain; local_20 != (rbu_file *)0x0; local_20 = local_20->pMainNext) {
    }
    p->pMainNext = prVar1->pMain;
    prVar1->pMain = p;
  }
  else {
    for (local_20 = prVar1->pMainRbu; local_20 != (rbu_file *)0x0 && local_20 != p;
        local_20 = local_20->pMainRbuNext) {
    }
    if (local_20 == (rbu_file *)0x0) {
      p->pMainRbuNext = prVar1->pMainRbu;
      prVar1->pMainRbu = p;
    }
  }
  sqlite3_mutex_leave(prVar1->mutex);
  return;
}

Assistant:

static void rbuMainlistAdd(rbu_file *p){
  rbu_vfs *pRbuVfs = p->pRbuVfs;
  rbu_file *pIter;
  assert( (p->openFlags & SQLITE_OPEN_MAIN_DB) );
  sqlite3_mutex_enter(pRbuVfs->mutex);
  if( p->pRbu==0 ){
    for(pIter=pRbuVfs->pMain; pIter; pIter=pIter->pMainNext);
    p->pMainNext = pRbuVfs->pMain;
    pRbuVfs->pMain = p;
  }else{
    for(pIter=pRbuVfs->pMainRbu; pIter && pIter!=p; pIter=pIter->pMainRbuNext){}
    if( pIter==0 ){
      p->pMainRbuNext = pRbuVfs->pMainRbu;
      pRbuVfs->pMainRbu = p;
    }
  }
  sqlite3_mutex_leave(pRbuVfs->mutex);
}